

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsSetRuntimeBeforeCollectCallback
          (JsRuntimeHandle runtime,void *callbackState,JsBeforeCollectCallback beforeCollectCallback
          )

{
  JsrtRuntime *this;
  JsErrorCode JVar1;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtime == (JsRuntimeHandle)0x0) {
    JVar1 = JsErrorInvalidArgument;
  }
  else {
    this = JsrtRuntime::FromHandle(runtime);
    JVar1 = JsNoError;
    JsrtRuntime::SetBeforeCollectCallback(this,beforeCollectCallback,callbackState);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar1;
}

Assistant:

CHAKRA_API JsSetRuntimeBeforeCollectCallback(_In_ JsRuntimeHandle runtime, _In_opt_ void *callbackState, _In_ JsBeforeCollectCallback beforeCollectCallback)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtime);

        JsrtRuntime::FromHandle(runtime)->SetBeforeCollectCallback(beforeCollectCallback, callbackState);
        return JsNoError;
    });
}